

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenCallIndirectSetTable(BinaryenExpressionRef expr,char *table)

{
  bool bVar1;
  Expression *expression;
  Name name;
  char *table_local;
  BinaryenExpressionRef expr_local;
  
  name.super_IString.str._M_str = table;
  wasm::Name::Name((Name *)&expression,table);
  bVar1 = wasm::Expression::is<wasm::CallIndirect>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<CallIndirect>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x922,"void BinaryenCallIndirectSetTable(BinaryenExpressionRef, const char *)");
  }
  wasm::Name::operator=((Name *)(expr + 4),(Name *)&expression);
  return;
}

Assistant:

void BinaryenCallIndirectSetTable(BinaryenExpressionRef expr,
                                  const char* table) {
  Name name(table);
  auto* expression = (Expression*)expr;

  assert(expression->is<CallIndirect>());
  static_cast<CallIndirect*>(expression)->table = name;
}